

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

int Cba_NtkFindMissing(Vec_Int_t *vObjs,int nObjs)

{
  int iVar1;
  Vec_Int_t *p;
  int local_30;
  int local_2c;
  int iObj;
  int i;
  Vec_Int_t *vMap;
  int nObjs_local;
  Vec_Int_t *vObjs_local;
  
  p = Vec_IntStartFull(nObjs + 1);
  for (local_2c = 0; iVar1 = Vec_IntSize(vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    iVar1 = Vec_IntEntry(vObjs,local_2c);
    Vec_IntWriteEntry(p,iVar1,local_2c);
  }
  local_30 = 1;
  while( true ) {
    iVar1 = Vec_IntSize(p);
    if (iVar1 <= local_30) {
      Vec_IntFree(p);
      return -1;
    }
    iVar1 = Vec_IntEntry(p,local_30);
    if (iVar1 == -1) break;
    local_30 = local_30 + 1;
  }
  Vec_IntFree(p);
  return local_30;
}

Assistant:

int Cba_NtkFindMissing( Vec_Int_t * vObjs, int nObjs )
{
    Vec_Int_t * vMap = Vec_IntStartFull( nObjs + 1 );
    int i, iObj;
    Vec_IntForEachEntry( vObjs, iObj, i )
        Vec_IntWriteEntry( vMap, iObj, i );
    Vec_IntForEachEntryStart( vMap, i, iObj, 1 )
        if ( i == -1 )
        {
            Vec_IntFree( vMap );
            return iObj;
        }
    Vec_IntFree( vMap );
    return -1;
}